

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O0

ParameterInfo * __thiscall ParameterInfo::operator=(ParameterInfo *this,ParameterInfo *info)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *pcVar3;
  Sint16 *pSVar4;
  float *pfVar5;
  Uint8 *pUVar6;
  ulong uVar7;
  int local_20;
  int local_1c;
  int i;
  int count;
  ParameterInfo *info_local;
  ParameterInfo *this_local;
  
  if (this != info) {
    if (this->name != (char *)0x0) {
      operator_delete__(this->name);
    }
    if (this->dimensions != (Uint8 *)0x0) {
      operator_delete__(this->dimensions);
    }
    if ((this->char_data != (char *)0x0) && (this->char_data != (char *)0x0)) {
      operator_delete__(this->char_data);
    }
    if ((this->int_data != (Sint16 *)0x0) && (this->int_data != (Sint16 *)0x0)) {
      operator_delete__(this->int_data);
    }
    if ((this->float_data != (float *)0x0) && (this->float_data != (float *)0x0)) {
      operator_delete__(this->float_data);
    }
    if (this->description != (char *)0x0) {
      operator_delete__(this->description);
    }
    this->name_length = info->name_length;
    this->group_id = info->group_id;
    this->name = (char *)0x0;
    this->next_offset = info->next_offset;
    this->data_type = info->data_type;
    this->n_dimensions = info->n_dimensions;
    this->dimensions = (Uint8 *)0x0;
    this->char_data = (char *)0x0;
    this->int_data = (Sint16 *)0x0;
    this->float_data = (float *)0x0;
    this->descr_length = info->descr_length;
    this->description = (char *)0x0;
    this->locked = (bool)(info->locked & 1);
    pcVar3 = (char *)operator_new__((long)(this->name_length + 1));
    this->name = pcVar3;
    memcpy(this->name,info->name,(long)(this->name_length + 1));
    if (info->dimensions == (Uint8 *)0x0) {
      if ((info->data_type == '\x01') || (info->data_type == -1)) {
        pcVar3 = (char *)operator_new__(1);
        this->char_data = pcVar3;
        *this->char_data = *info->char_data;
      }
      else if (info->data_type == '\x02') {
        pSVar4 = (Sint16 *)operator_new__(2);
        this->int_data = pSVar4;
        *this->int_data = *info->int_data;
      }
      else if (info->data_type == '\x04') {
        pfVar5 = (float *)operator_new__(4);
        this->float_data = pfVar5;
        *this->float_data = *info->float_data;
      }
    }
    else {
      pUVar6 = (Uint8 *)operator_new__((ulong)info->n_dimensions);
      this->dimensions = pUVar6;
      memcpy(this->dimensions,info->dimensions,(ulong)this->n_dimensions);
      local_1c = 1;
      for (local_20 = 0; local_20 < (int)(uint)this->n_dimensions; local_20 = local_20 + 1) {
        local_1c = (uint)this->dimensions[local_20] * local_1c;
      }
      if ((info->data_type == '\x01') || (info->data_type == -1)) {
        pcVar3 = (char *)operator_new__((long)local_1c);
        this->char_data = pcVar3;
        memcpy(this->char_data,info->char_data,(long)local_1c);
      }
      else if (info->data_type == '\x02') {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)local_1c;
        uVar7 = SUB168(auVar1 * ZEXT816(2),0);
        if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
          uVar7 = 0xffffffffffffffff;
        }
        pSVar4 = (Sint16 *)operator_new__(uVar7);
        this->int_data = pSVar4;
        memcpy(this->int_data,info->int_data,(long)local_1c << 1);
      }
      else if (info->data_type == '\x04') {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)local_1c;
        uVar7 = SUB168(auVar2 * ZEXT816(4),0);
        if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
          uVar7 = 0xffffffffffffffff;
        }
        pfVar5 = (float *)operator_new__(uVar7);
        this->float_data = pfVar5;
        memcpy(this->float_data,info->float_data,(long)local_1c << 2);
      }
    }
  }
  return this;
}

Assistant:

ParameterInfo& operator=(const ParameterInfo &info) {
		if (this != &info) {
			delete[] name;
			delete[] dimensions;

			if (char_data)
				delete[] char_data;
			if (int_data)
				delete[] int_data;
			if (float_data)
				delete[] float_data;

			delete[] description;

			name_length = info.name_length;
			group_id = info.group_id;
			name = NULL;
			next_offset = info.next_offset;
			data_type = info.data_type;
			n_dimensions = info.n_dimensions;
			dimensions = NULL;

			char_data = NULL;
			int_data = NULL;
			float_data = NULL;

			descr_length = info.descr_length;
			description = NULL;
			locked = info.locked;

			// Copy the data
			// we also need to copy the '\0' character at the end!
			name = new char[name_length + 1];
			memcpy (name, info.name, sizeof(char) * (name_length + 1));

			if (info.dimensions == 0) {
				// if dim == 0 the data comes right away
				if (info.data_type == 1 || info.data_type == -1) {
					char_data = new char[1];
					memcpy (char_data, info.char_data, sizeof (char));
				} else if (info.data_type == 2) {
					int_data = new Sint16[1];
					memcpy (int_data, info.int_data, sizeof (Sint16));
				} else if (info.data_type == 4) {
					float_data = new float[1];
					memcpy (float_data, info.float_data, sizeof (float));
				}
			} else {
				// we first have to read out the dimensions of the values and then we can
				// store the values
				dimensions = new Uint8[info.n_dimensions];

				memcpy(dimensions, info.dimensions, sizeof(Uint8) * n_dimensions);

				int count = 1;
				int i;
				for (i = 0; i < n_dimensions; i++) {
					count *= dimensions[i];
				}

				if (info.data_type == 1 || info.data_type == -1) {
					char_data = new char[count];
					memcpy (char_data, info.char_data, sizeof (char) * count);
				} else if (info.data_type == 2) {
					int_data = new Sint16[count];
					memcpy (int_data, info.int_data, sizeof (Sint16) * count);
				} else if (info.data_type == 4) {
					float_data = new float[count];
					memcpy (float_data, info.float_data, sizeof (float) * count);
				}
			}
		}

		return *this;
	}